

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

void VCProjectWriter::outputFilter(VCProject *project,XmlOutput *xml,QString *filtername)

{
  QArrayData *pQVar1;
  int *piVar2;
  QArrayData *pQVar3;
  char cVar4;
  long *plVar5;
  VCFilter *pVVar6;
  XmlOutput *pXVar7;
  Node *oldD;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  VCFilter filter;
  triState local_5e4;
  xml_output local_5d0;
  xml_output local_598;
  xml_output local_560;
  xml_output local_528;
  VCFilter local_4e8;
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((project->SingleProjects).d.ptr)->flat_files == true) {
    plVar5 = (long *)operator_new(0x10);
    *plVar5 = (long)&PTR__FlatNode_002dfdd0;
    plVar5[1] = 0;
  }
  else {
    plVar5 = (long *)operator_new(0x30);
    *plVar5 = (long)&PTR__TreeNode_002dfd68;
    *(undefined1 *)(plVar5 + 1) = 0;
    plVar5[2] = 0;
    plVar5[3] = 0;
    plVar5[4] = 0;
    plVar5[5] = 0;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  if ((project->SingleProjects).d.size == 0) {
    local_5e4 = unset;
  }
  else {
    local_5e4 = unset;
    uVar8 = 0;
    do {
      memset(&local_4e8,0xaa,0x448);
      pVVar6 = VCProjectSingleConfig::filterByName
                         ((project->SingleProjects).d.ptr + uVar8,filtername);
      VCFilter::VCFilter(&local_4e8,pVVar6);
      if (local_4e8.Files.d.size != 0) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          (**(code **)(*plVar5 + 0x10))
                    (plVar5,(long)&((local_4e8.Files.d.ptr)->file).d.d + lVar9,
                     &(local_4e8.Files.d.ptr)->excludeFromBuild + lVar9);
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (ulong)local_4e8.Files.d.size);
      }
      if (local_58.d.size == 0) {
        QString::operator=(&local_58,(QString *)&local_4e8);
        QString::operator=(&local_78,(QString *)&local_4e8.Filter);
        local_5e4 = local_4e8.ParseFiles;
        QString::operator=(&local_98,(QString *)&local_4e8.Guid);
      }
      VCFilter::~VCFilter(&local_4e8);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(project->SingleProjects).d.size);
  }
  cVar4 = (**(code **)(*plVar5 + 0x28))(plVar5);
  if (cVar4 != '\0') {
    if (local_58.d.size != 0) {
      QVar11.m_data = (storage_type *)0x6;
      QVar11.m_size = (qsizetype)&local_4e8;
      QString::fromUtf8(QVar11);
      local_4e8.Filter.d.d = (Data *)local_4e8.Name.d.size;
      pQVar3 = (QArrayData *)CONCAT44(local_4e8.Name.d.d._4_4_,(XMLType)local_4e8.Name.d.d);
      local_4e8.Name.d.d._0_4_ = tTag;
      local_4e8.Name.d.size = (qsizetype)local_4e8.Name.d.ptr;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_4e8.Filter.d.ptr = (char16_t *)0x0;
      local_4e8.Filter.d.size = 0;
      local_4e8.Guid.d.d = (Data *)0x0;
      local_4e8.Name.d.ptr = (char16_t *)pQVar3;
      pXVar7 = XmlOutput::operator<<(xml,(xml_output *)&local_4e8);
      if (local_58.d.size == 0) {
        local_528.xo_type = tNothing;
        local_528.xo_text.d.d = (Data *)0x0;
        local_528.xo_text.d.ptr = (char16_t *)0x0;
        local_528.xo_text.d.size = 0;
        local_528.xo_value.d.d = (Data *)0x0;
        local_528.xo_value.d.ptr = (char16_t *)0x0;
        local_528.xo_value.d.size = 0;
      }
      else {
        QVar12.m_data = (storage_type *)0x4;
        QVar12.m_size = (qsizetype)&local_528;
        QString::fromUtf8(QVar12);
        local_528.xo_text.d.size = (qsizetype)local_528.xo_text.d.ptr;
        pQVar1 = (QArrayData *)CONCAT44(local_528._4_4_,local_528.xo_type);
        local_528.xo_type = tAttribute;
        local_528.xo_text.d.ptr = (char16_t *)local_528.xo_text.d.d;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_528.xo_value.d.d = local_58.d.d;
        local_528.xo_value.d.ptr = local_58.d.ptr;
        local_528.xo_value.d.size = local_58.d.size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_528.xo_text.d.d = (Data *)pQVar1;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      pXVar7 = XmlOutput::operator<<(pXVar7,&local_528);
      if (local_78.d.size == 0) {
        local_560.xo_type = tNothing;
        local_560.xo_text.d.d = (Data *)0x0;
        local_560.xo_text.d.ptr = (char16_t *)0x0;
        local_560.xo_text.d.size = 0;
        local_560.xo_value.d.d = (Data *)0x0;
        local_560.xo_value.d.ptr = (char16_t *)0x0;
        local_560.xo_value.d.size = 0;
      }
      else {
        QVar13.m_data = (storage_type *)0x6;
        QVar13.m_size = (qsizetype)&local_560;
        QString::fromUtf8(QVar13);
        local_560.xo_text.d.size = (qsizetype)local_560.xo_text.d.ptr;
        pQVar1 = (QArrayData *)CONCAT44(local_560._4_4_,local_560.xo_type);
        local_560.xo_type = tAttribute;
        local_560.xo_text.d.ptr = (char16_t *)local_560.xo_text.d.d;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_560.xo_value.d.d = local_78.d.d;
        local_560.xo_value.d.ptr = local_78.d.ptr;
        local_560.xo_value.d.size = local_78.d.size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_560.xo_text.d.d = (Data *)pQVar1;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      pXVar7 = XmlOutput::operator<<(pXVar7,&local_560);
      if (local_98.d.size == 0) {
        local_598.xo_type = tNothing;
        local_598.xo_text.d.d = (Data *)0x0;
        local_598.xo_text.d.ptr = (char16_t *)0x0;
        local_598.xo_text.d.size = 0;
        local_598.xo_value.d.d = (Data *)0x0;
        local_598.xo_value.d.ptr = (char16_t *)0x0;
        local_598.xo_value.d.size = 0;
      }
      else {
        QVar14.m_data = (storage_type *)0x10;
        QVar14.m_size = (qsizetype)&local_598;
        QString::fromUtf8(QVar14);
        local_598.xo_text.d.size = (qsizetype)local_598.xo_text.d.ptr;
        pQVar1 = (QArrayData *)CONCAT44(local_598._4_4_,local_598.xo_type);
        local_598.xo_type = tAttribute;
        local_598.xo_text.d.ptr = (char16_t *)local_598.xo_text.d.d;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_598.xo_value.d.d = local_98.d.d;
        local_598.xo_value.d.ptr = local_98.d.ptr;
        local_598.xo_value.d.size = local_98.d.size;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_598.xo_text.d.d = (Data *)pQVar1;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      pXVar7 = XmlOutput::operator<<(pXVar7,&local_598);
      attrT(&local_5d0,"ParseFiles",local_5e4);
      XmlOutput::operator<<(pXVar7,&local_5d0);
      if (&(local_5d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_5d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_5d0.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_5d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_5d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_5d0.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_598.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_598.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_598.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_598.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_598.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_598.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_560.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_560.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_560.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_560.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_560.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_560.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_528.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_528.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_528.xo_value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_528.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_528.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_528.xo_text.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Filter.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)local_4e8.Filter.d.ptr,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Name.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate((QArrayData *)local_4e8.Name.d.ptr,2,0x10);
        }
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    QVar15.m_data = (storage_type *)0x0;
    QVar15.m_size = (qsizetype)&local_4e8;
    QString::fromUtf8(QVar15);
    local_528.xo_type = (XMLType)local_4e8.Name.d.d;
    local_528._4_4_ = local_4e8.Name.d.d._4_4_;
    local_528.xo_text.d.ptr = (char16_t *)local_4e8.Name.d.size;
    (**(code **)(*plVar5 + 0x20))(plVar5,xml,&local_528,project,filtername);
    piVar2 = (int *)CONCAT44(local_528._4_4_,local_528.xo_type);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_528._4_4_,local_528.xo_type),2,0x10);
      }
    }
    if (local_58.d.size != 0) {
      QVar16.m_data = (storage_type *)0x6;
      QVar16.m_size = (qsizetype)&local_4e8;
      QString::fromUtf8(QVar16);
      local_4e8.Filter.d.d = (Data *)local_4e8.Name.d.size;
      pQVar3 = (QArrayData *)CONCAT44(local_4e8.Name.d.d._4_4_,(XMLType)local_4e8.Name.d.d);
      local_4e8.Name.d.d._0_4_ = tCloseTag;
      local_4e8.Name.d.size = (qsizetype)local_4e8.Name.d.ptr;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_4e8.Filter.d.ptr = (char16_t *)0x0;
      local_4e8.Filter.d.size = 0;
      local_4e8.Guid.d.d = (Data *)0x0;
      local_4e8.Name.d.ptr = (char16_t *)pQVar3;
      XmlOutput::operator<<(xml,(xml_output *)&local_4e8);
      if ((QArrayData *)local_4e8.Filter.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Filter.d.ptr)->_q_value).super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate((QArrayData *)local_4e8.Filter.d.ptr,2,0x10);
        }
      }
      if ((QArrayData *)local_4e8.Name.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate((QArrayData *)local_4e8.Name.d.ptr,2,0x10);
        }
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VCProjectWriter::outputFilter(VCProject &project, XmlOutput &xml, const QString &filtername)
{
    QScopedPointer<Node> root;
    if (project.SingleProjects.at(0).flat_files)
        root.reset(new FlatNode);
    else
        root.reset(new TreeNode);

    QString name, extfilter, guid;
    triState parse = unset;

    for (int i = 0; i < project.SingleProjects.size(); ++i) {
        const VCFilter filter = project.SingleProjects.at(i).filterByName(filtername);

        // Merge all files in this filter to root tree
        for (int x = 0; x < filter.Files.size(); ++x)
            root->addElement(filter.Files.at(x));

        // Save filter setting from first filter. Next filters
        // may differ but we cannot handle that. (ex. extfilter)
        if (name.isEmpty()) {
            name = filter.Name;
            extfilter = filter.Filter;
            parse = filter.ParseFiles;
            guid = filter.Guid;
        }
    }

    if (!root->hasElements())
        return;

    // Actual XML output ----------------------------------
    if (!name.isEmpty()) {
        xml << tag(_Filter)
                << attrS(_Name, name)
                << attrS(_Filter, extfilter)
                << attrS(_UniqueIdentifier, guid)
                << attrT(_ParseFiles, parse);
    }
    root->generateXML(xml, "", project, filtername); // output root tree
    if (!name.isEmpty())
        xml << closetag(_Filter);
}